

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler_test.cpp
# Opt level: O0

void __thiscall TestCase::check(TestCase *this)

{
  bool bVar1;
  __int_type_conflict1 _Var2;
  uint64_t uVar3;
  atomic<bool> *in_RDI;
  undefined1 uVar4;
  undefined1 uVar5;
  bool timeout_reached;
  bool unlock_is_before_timeout;
  bool unlock_reached;
  uint64_t time_us;
  undefined1 in_stack_ffffffffffffffdf;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffef;
  
  bVar1 = std::atomic::operator_cast_to_bool
                    ((atomic<bool> *)
                     CONCAT17(in_stack_ffffffffffffffef,
                              CONCAT16(in_stack_ffffffffffffffee,
                                       CONCAT15(in_stack_ffffffffffffffed,in_stack_ffffffffffffffe8)
                                      )));
  if (!bVar1) {
    uVar3 = LockstepScheduler::get_absolute_time((LockstepScheduler *)0x1110e5);
    uVar4 = *(uint *)(in_RDI + 4) <= uVar3;
    uVar6 = *(uint *)(in_RDI + 4) <= *(uint *)in_RDI;
    uVar5 = *(uint *)in_RDI <= uVar3;
    if (((!(bool)uVar4) || (!(bool)uVar6)) || ((bool)uVar5)) {
      if ((bool)uVar5) {
        std::atomic<bool>::operator=(in_RDI,(bool)in_stack_ffffffffffffffdf);
        std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1111f6);
        std::thread::join();
        _Var2 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)
                           CONCAT17(uVar4,CONCAT16(uVar6,CONCAT15(uVar5,in_stack_ffffffffffffffe8)))
                          );
        if (_Var2 != -1) {
          __assert_fail("result_ == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                        ,0x8d,"void TestCase::check()");
        }
      }
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 0x38));
      pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 8));
      pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 0x38));
      std::atomic<bool>::operator=(in_RDI,(bool)in_stack_ffffffffffffffdf);
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x111190);
      std::thread::join();
      _Var2 = std::__atomic_base::operator_cast_to_int
                        ((__atomic_base<int> *)
                         CONCAT17(uVar4,CONCAT16(uVar6,CONCAT15(uVar5,in_stack_ffffffffffffffe8))));
      if (_Var2 != 0) {
        __assert_fail("result_ == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/julianoes[P]lockstep-scheduler/test/src/lockstep_scheduler_test.cpp"
                      ,0x87,"void TestCase::check()");
      }
    }
  }
  return;
}

Assistant:

void check()
    {
        if (is_done_) {
            return;
        }

        uint64_t time_us = ls_.get_absolute_time();

        const bool unlock_reached = (time_us >= unlocked_after_);
        const bool unlock_is_before_timeout = (unlocked_after_ <= timeout_);
        const bool timeout_reached = (time_us >= timeout_);

        if (unlock_reached && unlock_is_before_timeout && !(timeout_reached)) {
            pthread_mutex_lock(&lock_);
            pthread_cond_broadcast(&cond_);
            pthread_mutex_unlock(&lock_);
            is_done_ = true;
            // We can be sure that this triggers.
            thread_->join();
            assert(result_ == 0);
        }

        else if (timeout_reached) {
            is_done_ = true;
            thread_->join();
            assert(result_ == -1);
        }
    }